

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O2

StatementSyntax * __thiscall
slang::parsing::Parser::parseStatement(Parser *this,bool allowEmpty,bool allowSuperNew)

{
  bool bVar1;
  TokenKind TVar2;
  TokenKind endKind;
  NamedLabelSyntax *label;
  ForLoopStatementSyntax *pFVar3;
  TimingControlSyntax *timingControl;
  StatementSyntax *pSVar4;
  undefined8 uVar5;
  ExpressionSyntax *expr;
  SourceLocation SVar6;
  Diagnostic *this_00;
  uint uVar7;
  Info *pIVar8;
  __extent_storage<18446744073709551615UL> _Var9;
  SyntaxKind SVar10;
  uint32_t offset;
  Token TVar11;
  Token TVar12;
  AttrList attributes;
  string_view sVar13;
  Token local_c8;
  SyntaxNode *local_b8;
  SyntaxNode *pSStack_b0;
  size_t local_a8;
  AttrList local_a0;
  DepthGuard dg;
  Token local_80;
  Token local_70;
  Token local_60;
  Token local_50;
  Token local_40;
  
  DepthGuard::DepthGuard(&dg,this);
  TVar11 = ParserBase::peek(&this->super_ParserBase);
  if ((TVar11.kind == Identifier) &&
     (TVar11 = ParserBase::peek(&this->super_ParserBase,1), TVar11.kind == Colon)) {
    TVar11 = ParserBase::consume(&this->super_ParserBase);
    TVar12 = ParserBase::consume(&this->super_ParserBase);
    label = slang::syntax::SyntaxFactory::namedLabel(&this->factory,TVar11,TVar12);
  }
  else {
    label = (NamedLabelSyntax *)0x0;
  }
  attributes = parseAttributes(this);
  _Var9 = attributes._M_extent._M_extent_value;
  TVar11 = ParserBase::peek(&this->super_ParserBase);
  TVar2 = TVar11.kind;
  local_a8 = _Var9._M_extent_value;
  local_a0 = attributes;
  switch(TVar2) {
  case AssertKeyword:
  case AssumeKeyword:
switchD_002bdd02_caseD_81:
    pFVar3 = (ForLoopStatementSyntax *)parseAssertionStatement(this,label,attributes);
    goto LAB_002be2fb;
  case AssignKeyword:
    SVar10 = ProceduralAssignStatement;
LAB_002bdefe:
    pFVar3 = (ForLoopStatementSyntax *)parseProceduralAssignStatement(this,label,attributes,SVar10);
    goto LAB_002be2fb;
  case AutomaticKeyword:
  case BeforeKeyword:
  case BindKeyword:
  case BinsKeyword:
  case BinsOfKeyword:
  case BitKeyword:
  case BufKeyword:
  case BufIf0Keyword:
  case BufIf1Keyword:
  case ByteKeyword:
    goto switchD_002bdd28_caseD_149;
  case BeginKeyword:
    endKind = EndKeyword;
    SVar10 = SequentialBlockStatement;
LAB_002bdedf:
    pFVar3 = (ForLoopStatementSyntax *)parseBlock(this,SVar10,endKind,label,attributes);
    goto LAB_002be2fb;
  case BreakKeyword:
switchD_002bdd02_caseD_80:
    pFVar3 = (ForLoopStatementSyntax *)parseJumpStatement(this,label,attributes);
    goto LAB_002be2fb;
  case CaseKeyword:
  case CaseXKeyword:
  case CaseZKeyword:
    Token::Token(&local_60);
    local_70 = ParserBase::consume(&this->super_ParserBase);
    pFVar3 = (ForLoopStatementSyntax *)parseCaseStatement(this,label,attributes,local_60,local_70);
    goto LAB_002be2fb;
  default:
    uVar7 = TVar2 - 0xaa;
    if (uVar7 < 0xd) {
      pIVar8 = (Info *)((long)&switchD_002bdc3b::switchdataD_004c3c1c +
                       (long)(int)(&switchD_002bdc3b::switchdataD_004c3c1c)[uVar7]);
      switch((uint)TVar2) {
      case 0xaa:
        pFVar3 = parseForLoopStatement(this,label,attributes);
        break;
      case 0xab:
        SVar10 = ProceduralForceStatement;
        goto LAB_002bdefe;
      case 0xac:
        pFVar3 = (ForLoopStatementSyntax *)parseForeachLoopStatement(this,label,attributes);
        break;
      case 0xad:
        TVar12 = ParserBase::consume(&this->super_ParserBase);
        uVar5 = TVar12._0_8_;
        pSVar4 = parseStatement(this,true,false);
        sVar13._M_str = "forever loop";
        sVar13._M_len = 0xc;
        TVar11.info = pIVar8;
        TVar11.kind = (short)uVar5;
        TVar11._2_1_ = (char)((ulong)uVar5 >> 0x10);
        TVar11.numFlags.raw = (char)((ulong)uVar5 >> 0x18);
        TVar11.rawLen = (int)((ulong)uVar5 >> 0x20);
        checkEmptyBody(this,&pSVar4->super_SyntaxNode,TVar11,sVar13);
        local_c8.info._0_4_ = 1;
        local_b8 = (SyntaxNode *)0x0;
        pSStack_b0 = (SyntaxNode *)0x0;
        local_c8._0_8_ = &PTR_getChild_006a3268;
        pFVar3 = (ForLoopStatementSyntax *)
                 slang::syntax::SyntaxFactory::foreverStatement
                           (&this->factory,label,
                            (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&local_c8,TVar12,
                            pSVar4);
        break;
      case 0xae:
        endKind = JoinKeyword;
        SVar10 = ParallelBlockStatement;
        goto LAB_002bdedf;
      default:
        goto switchD_002bdd28_caseD_149;
      case 0xb6:
        Token::Token(&local_80);
LAB_002bdfa9:
        pFVar3 = (ForLoopStatementSyntax *)parseConditionalStatement(this,label,attributes,local_80)
        ;
      }
      goto LAB_002be2fb;
    }
  }
  switch(TVar2) {
  case RandCaseKeyword:
    pFVar3 = (ForLoopStatementSyntax *)parseRandCaseStatement(this,label,attributes);
    break;
  case RandSequenceKeyword:
    pFVar3 = (ForLoopStatementSyntax *)parseRandSequenceStatement(this,label,attributes);
    break;
  case RcmosKeyword:
  case RealKeyword:
  case RealTimeKeyword:
  case RefKeyword:
  case RegKeyword:
  case RejectOnKeyword:
    goto switchD_002bdd28_caseD_149;
  case ReleaseKeyword:
    SVar10 = ProceduralReleaseStatement;
LAB_002bdf4e:
    pFVar3 = (ForLoopStatementSyntax *)
             parseProceduralDeassignStatement(this,label,attributes,SVar10);
    break;
  case RepeatKeyword:
switchD_002bdd28_caseD_14d:
    pFVar3 = (ForLoopStatementSyntax *)parseLoopStatement(this,label,attributes);
    break;
  case RestrictKeyword:
switchD_002bdc61_caseD_105:
    pFVar3 = (ForLoopStatementSyntax *)parseConcurrentAssertion(this,label,attributes);
    break;
  case ReturnKeyword:
    pFVar3 = (ForLoopStatementSyntax *)parseReturnStatement(this,label,attributes);
    break;
  default:
    uVar7 = TVar2 - 0x26;
    if (uVar7 < 0x32) {
      if ((0x2000000000300U >> ((ulong)uVar7 & 0x3f) & 1) != 0) {
        timingControl = parseTimingControl(this,false);
        local_c8.info._0_4_ = 1;
        local_b8 = (SyntaxNode *)0x0;
        pSStack_b0 = (SyntaxNode *)0x0;
        local_c8._0_8_ = &PTR_getChild_006a3268;
        pSVar4 = parseStatement(this,true,false);
        pFVar3 = (ForLoopStatementSyntax *)
                 slang::syntax::SyntaxFactory::timingControlStatement
                           (&this->factory,label,
                            (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&local_c8,
                            timingControl,pSVar4);
        break;
      }
      if ((3UL >> ((ulong)uVar7 & 0x3f) & 1) != 0) {
        pFVar3 = (ForLoopStatementSyntax *)parseEventTriggerStatement(this,label,attributes);
        break;
      }
    }
    switch(TVar2) {
    case ContinueKeyword:
      goto switchD_002bdd02_caseD_80;
    case CoverKeyword:
      goto switchD_002bdd02_caseD_81;
    case CoverGroupKeyword:
    case CoverPointKeyword:
    case CrossKeyword:
    case DefaultKeyword:
    case DefParamKeyword:
    case DesignKeyword:
    case DistKeyword:
      goto switchD_002bdd28_caseD_149;
    case DeassignKeyword:
      SVar10 = ProceduralDeassignStatement;
      goto LAB_002bdf4e;
    case DisableKeyword:
      pFVar3 = (ForLoopStatementSyntax *)parseDisableStatement(this,label,attributes);
      break;
    case DoKeyword:
      pFVar3 = (ForLoopStatementSyntax *)parseDoWhileStatement(this,label,attributes);
      break;
    default:
      switch(TVar2) {
      case VoidKeyword:
        pFVar3 = (ForLoopStatementSyntax *)parseVoidCallStatement(this,label,attributes);
        break;
      case WaitKeyword:
        pFVar3 = (ForLoopStatementSyntax *)parseWaitStatement(this,label,attributes);
        break;
      case WaitOrderKeyword:
        pFVar3 = (ForLoopStatementSyntax *)parseWaitOrderStatement(this,label,attributes);
        break;
      case WhileKeyword:
        goto switchD_002bdd28_caseD_14d;
      default:
        if (TVar2 - 0x13b < 2) {
LAB_002bdd56:
          TVar11 = ParserBase::peek(&this->super_ParserBase,1);
          if (TVar11.kind - 0x73 < 3) {
            TVar11 = ParserBase::consume(&this->super_ParserBase);
            local_50 = ParserBase::consume(&this->super_ParserBase);
            pFVar3 = (ForLoopStatementSyntax *)
                     parseCaseStatement(this,label,attributes,TVar11,local_50);
            break;
          }
          if (TVar11.kind != IfKeyword) {
            local_c8 = ParserBase::peek(&this->super_ParserBase,1);
            SVar6 = Token::location(&local_c8);
            this_00 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x420005,SVar6);
            TVar11 = ParserBase::peek(&this->super_ParserBase);
            sVar13 = LexerFacts::getTokenKindText(TVar11.kind);
            Diagnostic::operator<<(this_00,sVar13);
            ParserBase::skipToken(&this->super_ParserBase,(optional<slang::DiagCode>)0x0);
            local_c8.info._0_4_ = 1;
            local_b8 = (SyntaxNode *)0x0;
            pSStack_b0 = (SyntaxNode *)0x0;
            local_c8._0_8_ = &PTR_getChild_006a3268;
            local_40 = ParserBase::peek(&this->super_ParserBase);
            SVar6 = Token::location(&local_40);
            TVar11 = ParserBase::missingToken(&this->super_ParserBase,Semicolon,SVar6);
            pFVar3 = (ForLoopStatementSyntax *)
                     slang::syntax::SyntaxFactory::emptyStatement
                               (&this->factory,label,
                                (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&local_c8,
                                TVar11);
            break;
          }
          local_80 = ParserBase::consume(&this->super_ParserBase);
          goto LAB_002bdfa9;
        }
        if (TVar2 == Identifier) {
          offset = 1;
          TVar11 = ParserBase::peek(&this->super_ParserBase,1);
          if (TVar11.kind == DoubleColon) {
            TVar11 = ParserBase::peek(&this->super_ParserBase,2);
            offset = (uint)(TVar11.kind == Identifier) * 2 + 1;
          }
          TVar11 = ParserBase::peek(&this->super_ParserBase,offset);
          if ((TVar11.kind == Identifier) &&
             (TVar11 = ParserBase::peek(&this->super_ParserBase,offset + 1),
             TVar11.kind == OpenParenthesis)) {
            pFVar3 = (ForLoopStatementSyntax *)parseCheckerStatement(this,label,attributes);
            break;
          }
        }
        else {
          if (TVar2 == Semicolon) {
            if (label == (NamedLabelSyntax *)0x0) {
              if (!allowEmpty) {
                local_c8 = ParserBase::peek(&this->super_ParserBase);
                SVar6 = Token::location(&local_c8);
                ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x510005,SVar6);
              }
            }
            else {
              local_c8 = ParserBase::peek(&this->super_ParserBase);
              SVar6 = Token::location(&local_c8);
              ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x860005,SVar6);
            }
            local_c8.info._0_4_ = 1;
            local_b8 = (SyntaxNode *)0x0;
            pSStack_b0 = (SyntaxNode *)0x0;
            local_c8._0_8_ = &PTR_getChild_006a3268;
            TVar11 = ParserBase::consume(&this->super_ParserBase);
            pFVar3 = (ForLoopStatementSyntax *)
                     slang::syntax::SyntaxFactory::emptyStatement
                               (&this->factory,label,
                                (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&local_c8,
                                TVar11);
            break;
          }
          if (TVar2 == ExpectKeyword) goto switchD_002bdc61_caseD_105;
          if (TVar2 == PriorityKeyword) goto LAB_002bdd56;
          if ((((TVar2 == UnitSystemName) &&
               (TVar11 = ParserBase::peek(&this->super_ParserBase,1), TVar11.kind == DoubleColon))
              && (TVar11 = ParserBase::peek(&this->super_ParserBase,2), TVar11.kind == Identifier))
             && ((TVar11 = ParserBase::peek(&this->super_ParserBase,3), TVar11.kind == Identifier &&
                 (TVar11 = ParserBase::peek(&this->super_ParserBase,4),
                 TVar11.kind == OpenParenthesis)))) {
            pFVar3 = (ForLoopStatementSyntax *)parseCheckerStatement(this,label,attributes);
            break;
          }
        }
      case WAndKeyword:
      case WeakKeyword:
      case Weak0Keyword:
      case Weak1Keyword:
switchD_002bdd28_caseD_149:
        TVar11 = ParserBase::peek(&this->super_ParserBase);
        bVar1 = slang::syntax::SyntaxFacts::isPossibleExpression(TVar11.kind);
        if (bVar1) {
          expr = parseSubExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)
                                         ((uint)allowSuperNew * 8 + 2),0);
          local_c8.info._0_4_ = 1;
          local_b8 = (SyntaxNode *)0x0;
          pSStack_b0 = (SyntaxNode *)0x0;
          local_c8._0_8_ = &PTR_getChild_006a3268;
          TVar11 = ParserBase::expect(&this->super_ParserBase,Semicolon);
          pFVar3 = (ForLoopStatementSyntax *)
                   slang::syntax::SyntaxFactory::expressionStatement
                             (&this->factory,label,
                              (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&local_c8,expr,
                              TVar11);
        }
        else {
          local_c8 = ParserBase::peek(&this->super_ParserBase);
          SVar6 = Token::location(&local_c8);
          ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x510005,SVar6);
          local_c8.info._0_4_ = 1;
          local_b8 = (SyntaxNode *)0x0;
          pSStack_b0 = (SyntaxNode *)0x0;
          local_c8._0_8_ = &PTR_getChild_006a3268;
          local_40 = ParserBase::peek(&this->super_ParserBase);
          SVar6 = Token::location(&local_40);
          TVar11 = ParserBase::missingToken(&this->super_ParserBase,Semicolon,SVar6);
          pFVar3 = (ForLoopStatementSyntax *)
                   slang::syntax::SyntaxFactory::emptyStatement
                             (&this->factory,label,
                              (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&local_c8,TVar11
                             );
        }
      }
    }
  }
LAB_002be2fb:
  (dg.parser)->recursionDepth = (dg.parser)->recursionDepth - 1;
  return &pFVar3->super_StatementSyntax;
}

Assistant:

StatementSyntax& Parser::parseStatement(bool allowEmpty, bool allowSuperNew) {
    auto dg = setDepthGuard();

    NamedLabelSyntax* label = nullptr;
    if (peek().kind == TokenKind::Identifier && peek(1).kind == TokenKind::Colon) {
        auto name = consume();
        label = &factory.namedLabel(name, consume());
    }

    auto attributes = parseAttributes();
    switch (peek().kind) {
        case TokenKind::UniqueKeyword:
        case TokenKind::Unique0Keyword:
        case TokenKind::PriorityKeyword: {
            switch (peek(1).kind) {
                case TokenKind::IfKeyword:
                    return parseConditionalStatement(label, attributes, consume());
                case TokenKind::CaseKeyword:
                case TokenKind::CaseXKeyword:
                case TokenKind::CaseZKeyword: {
                    auto modifier = consume();
                    return parseCaseStatement(label, attributes, modifier, consume());
                }
                default: {
                    addDiag(diag::ExpectedIfOrCase, peek(1).location())
                        << LexerFacts::getTokenKindText(peek().kind);
                    skipToken(std::nullopt);
                    return factory.emptyStatement(
                        label, attributes, missingToken(TokenKind::Semicolon, peek().location()));
                }
            }
        }
        case TokenKind::CaseKeyword:
        case TokenKind::CaseXKeyword:
        case TokenKind::CaseZKeyword:
            return parseCaseStatement(label, attributes, Token(), consume());
        case TokenKind::IfKeyword:
            return parseConditionalStatement(label, attributes, Token());
        case TokenKind::ForeverKeyword: {
            auto forever = consume();
            auto& body = parseStatement();
            checkEmptyBody(body, forever, "forever loop"sv);
            return factory.foreverStatement(label, attributes, forever, body);
        }
        case TokenKind::RepeatKeyword:
        case TokenKind::WhileKeyword:
            return parseLoopStatement(label, attributes);
        case TokenKind::DoKeyword:
            return parseDoWhileStatement(label, attributes);
        case TokenKind::ForKeyword:
            return parseForLoopStatement(label, attributes);
        case TokenKind::ForeachKeyword:
            return parseForeachLoopStatement(label, attributes);
        case TokenKind::ReturnKeyword:
            return parseReturnStatement(label, attributes);
        case TokenKind::BreakKeyword:
        case TokenKind::ContinueKeyword:
            return parseJumpStatement(label, attributes);
        case TokenKind::Hash:
        case TokenKind::DoubleHash:
        case TokenKind::At: {
            auto timingControl = parseTimingControl();
            SLANG_ASSERT(timingControl);
            return factory.timingControlStatement(label, attributes, *timingControl,
                                                  parseStatement());
        }
        case TokenKind::AssignKeyword:
            return parseProceduralAssignStatement(label, attributes,
                                                  SyntaxKind::ProceduralAssignStatement);
        case TokenKind::ForceKeyword:
            return parseProceduralAssignStatement(label, attributes,
                                                  SyntaxKind::ProceduralForceStatement);
        case TokenKind::DeassignKeyword:
            return parseProceduralDeassignStatement(label, attributes,
                                                    SyntaxKind::ProceduralDeassignStatement);
        case TokenKind::ReleaseKeyword:
            return parseProceduralDeassignStatement(label, attributes,
                                                    SyntaxKind::ProceduralReleaseStatement);
        case TokenKind::DisableKeyword:
            return parseDisableStatement(label, attributes);
        case TokenKind::BeginKeyword:
            return parseBlock(SyntaxKind::SequentialBlockStatement, TokenKind::EndKeyword, label,
                              attributes);
        case TokenKind::ForkKeyword:
            return parseBlock(SyntaxKind::ParallelBlockStatement, TokenKind::JoinKeyword, label,
                              attributes);
        case TokenKind::AssertKeyword:
        case TokenKind::AssumeKeyword:
        case TokenKind::CoverKeyword:
            return parseAssertionStatement(label, attributes);
        case TokenKind::RestrictKeyword:
        case TokenKind::ExpectKeyword:
            return parseConcurrentAssertion(label, attributes);
        case TokenKind::WaitKeyword:
            return parseWaitStatement(label, attributes);
        case TokenKind::WaitOrderKeyword:
            return parseWaitOrderStatement(label, attributes);
        case TokenKind::RandCaseKeyword:
            return parseRandCaseStatement(label, attributes);
        case TokenKind::RandSequenceKeyword:
            return parseRandSequenceStatement(label, attributes);
        case TokenKind::Semicolon:
            if (label)
                addDiag(diag::NoLabelOnSemicolon, peek().location());
            else if (!allowEmpty)
                addDiag(diag::ExpectedStatement, peek().location());
            return factory.emptyStatement(label, attributes, consume());
        case TokenKind::MinusArrow:
        case TokenKind::MinusDoubleArrow:
            return parseEventTriggerStatement(label, attributes);
        case TokenKind::VoidKeyword:
            return parseVoidCallStatement(label, attributes);
        case TokenKind::Identifier: {
            // This could be a checker instantiation.
            uint32_t index = 1;
            if (peek(index).kind == TokenKind::DoubleColon &&
                peek(index + 1).kind == TokenKind::Identifier) {
                index = 3;
            }

            if (peek(index).kind == TokenKind::Identifier &&
                peek(index + 1).kind == TokenKind::OpenParenthesis) {
                return parseCheckerStatement(label, attributes);
            }

            break;
        }
        case TokenKind::UnitSystemName:
            if (peek(1).kind == TokenKind::DoubleColon && peek(2).kind == TokenKind::Identifier &&
                peek(3).kind == TokenKind::Identifier &&
                peek(4).kind == TokenKind::OpenParenthesis) {
                return parseCheckerStatement(label, attributes);
            }
            break;
        default:
            break;
    }

    // everything else should be some kind of expression
    if (isPossibleExpression(peek().kind)) {
        bitmask<ExpressionOptions> options = ExpressionOptions::ProceduralAssignmentContext;
        if (allowSuperNew)
            options |= ExpressionOptions::AllowSuperNewCall;

        auto& expr = parseSubExpression(options, 0);
        return factory.expressionStatement(label, attributes, expr, expect(TokenKind::Semicolon));
    }

    addDiag(diag::ExpectedStatement, peek().location());
    return factory.emptyStatement(label, attributes,
                                  missingToken(TokenKind::Semicolon, peek().location()));
}